

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void __thiscall DataFileTest::testWriteGenericByName(DataFileTest *this)

{
  NodePtr *pNVar1;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  void *__buf;
  GenericDatum *pGVar2;
  char *in_RDI;
  int i;
  GenericRecord *r;
  GenericDatum *c;
  Pair p;
  int64_t im;
  int64_t re;
  DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_> df;
  string *in_stack_fffffffffffffeb8;
  pair<avro::ValidSchema,_avro::GenericDatum> *in_stack_fffffffffffffec0;
  ValidSchema *in_stack_fffffffffffffec8;
  pair<avro::ValidSchema,_avro::GenericDatum> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  ValidSchema *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_> *in_stack_fffffffffffffef0;
  allocator<char> *__a;
  allocator<char> local_f1;
  string local_f0 [32];
  undefined1 local_d0 [24];
  string local_b8 [52];
  int local_84;
  GenericRecord *local_80;
  GenericDatum local_78;
  undefined1 *local_68;
  GenericDatum local_40;
  undefined1 local_30 [16];
  long local_20;
  long local_18;
  DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_> local_10 [2];
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
  __n = 100;
  avro::DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::DataFileWriter
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,(Codec)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  local_18 = 3;
  local_20 = 5;
  avro::GenericDatum::GenericDatum((GenericDatum *)0x249a22);
  std::pair<avro::ValidSchema,_avro::GenericDatum>::pair<avro::GenericDatum,_true>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (GenericDatum *)in_stack_fffffffffffffec0);
  avro::GenericDatum::~GenericDatum((GenericDatum *)0x249a4d);
  local_68 = local_30;
  pNVar1 = avro::ValidSchema::root((ValidSchema *)(in_RDI + 8));
  avro::GenericDatum::GenericDatum(&local_78,(shared_ptr *)pNVar1);
  pGVar2 = &local_78;
  avro::GenericDatum::operator=
            ((GenericDatum *)in_stack_fffffffffffffec0,(GenericDatum *)in_stack_fffffffffffffeb8);
  avro::GenericDatum::~GenericDatum((GenericDatum *)0x249a9f);
  local_80 = avro::GenericDatum::value<avro::GenericRecord>((GenericDatum *)0x249aac);
  for (local_84 = 0; local_84 < 1000; local_84 = local_84 + 1) {
    avro::GenericDatum::GenericDatum
              ((GenericDatum *)in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8);
    __a = (allocator<char> *)(local_d0 + 0x17);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,__a);
    avro::GenericRecord::field((GenericRecord *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8)
    ;
    avro::GenericDatum::operator=
              ((GenericDatum *)in_stack_fffffffffffffec0,(GenericDatum *)in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(local_d0 + 0x17));
    avro::GenericDatum::~GenericDatum((GenericDatum *)0x249b75);
    avro::GenericDatum::GenericDatum
              ((GenericDatum *)in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,__a);
    in_stack_fffffffffffffec0 =
         (pair<avro::ValidSchema,_avro::GenericDatum> *)
         avro::GenericRecord::field
                   ((GenericRecord *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffeb8 = (string *)local_d0;
    avro::GenericDatum::operator=
              ((GenericDatum *)in_stack_fffffffffffffec0,(GenericDatum *)in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    avro::GenericDatum::~GenericDatum((GenericDatum *)0x249c03);
    pGVar2 = &local_40;
    avro::DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::write
              (local_10,(int)pGVar2,__buf,__n);
    local_18 = local_20 * local_18;
    local_20 = local_20 + 3;
  }
  avro::DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::close
            (local_10,(int)pGVar2);
  std::pair<avro::ValidSchema,_avro::GenericDatum>::~pair(in_stack_fffffffffffffec0);
  avro::DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::~DataFileWriter
            ((DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_> *)0x249d7d);
  return;
}

Assistant:

void testWriteGenericByName() {
        avro::DataFileWriter<Pair> df(filename, writerSchema, 100);
        int64_t re = 3;
        int64_t im = 5;
        Pair p(writerSchema, GenericDatum());

        GenericDatum& c = p.second;
        c = GenericDatum(writerSchema.root());
        GenericRecord& r = c.value<GenericRecord>();

        for (int i = 0; i < count; ++i, re *= im, im += 3) {
            r.field("re") = re;
            r.field("im") = im;
            df.write(p);
        }
        df.close();
    }